

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O0

bool __thiscall
ShortestVectorFirstComparator::operator()
          (ShortestVectorFirstComparator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *a,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *b)

{
  long lVar1;
  __synth3way_t<unsigned_char> _Var2;
  size_type sVar3;
  size_type sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (sVar3 < sVar4) {
    local_a = true;
  }
  else {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (sVar4 < sVar3) {
      local_a = false;
    }
    else {
      _Var2 = std::operator<=><unsigned_char,std::allocator<unsigned_char>>(in_RSI,in_RDX);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                 (__unspec *)0x340510);
      local_a = std::operator<(_Var2._M_value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const std::vector<unsigned char>& a, const std::vector<unsigned char>& b) const
    {
        if (a.size() < b.size()) return true;
        if (a.size() > b.size()) return false;
        return a < b;
    }